

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_uncompress2mem(char *filename,FILE *diskfile,int hdl)

{
  char *pcVar1;
  int local_2c;
  size_t sStack_28;
  int status;
  size_t finalsize;
  FILE *pFStack_18;
  int hdl_local;
  FILE *diskfile_local;
  char *filename_local;
  
  local_2c = 0;
  finalsize._4_4_ = hdl;
  pFStack_18 = diskfile;
  diskfile_local = (FILE *)filename;
  pcVar1 = strstr(filename,".Z");
  if (pcVar1 == (char *)0x0) {
    uncompress2mem((char *)diskfile_local,pFStack_18,memTable[finalsize._4_4_].memaddrptr,
                   memTable[finalsize._4_4_].memsizeptr,realloc,&stack0xffffffffffffffd8,&local_2c);
  }
  else {
    zuncompress2mem((char *)diskfile_local,pFStack_18,memTable[finalsize._4_4_].memaddrptr,
                    memTable[finalsize._4_4_].memsizeptr,realloc,&stack0xffffffffffffffd8,&local_2c)
    ;
  }
  memTable[finalsize._4_4_].currentpos = 0;
  memTable[finalsize._4_4_].fitsfilesize = sStack_28;
  return local_2c;
}

Assistant:

int mem_uncompress2mem(char *filename, FILE *diskfile, int hdl)
{
/*
  lower level routine to uncompress a file into memory.  The file
  has already been opened and the memory buffer has been allocated.
*/

  size_t finalsize;
  int status;
  /* uncompress file into memory */
  status = 0;

    if (strstr(filename, ".Z")) {
         zuncompress2mem(filename, diskfile,
		 memTable[hdl].memaddrptr,   /* pointer to memory address */
		 memTable[hdl].memsizeptr,   /* pointer to size of memory */
		 realloc,                     /* reallocation function */
		 &finalsize, &status);        /* returned file size nd status*/
#if HAVE_BZIP2
    } else if (strstr(filename, ".bz2")) {
        bzip2uncompress2mem(filename, diskfile, hdl, &finalsize, &status);
#endif
    } else {
         uncompress2mem(filename, diskfile,
		 memTable[hdl].memaddrptr,   /* pointer to memory address */
		 memTable[hdl].memsizeptr,   /* pointer to size of memory */
		 realloc,                     /* reallocation function */
		 &finalsize, &status);        /* returned file size nd status*/
    } 

  memTable[hdl].currentpos = 0;           /* save starting position */
  memTable[hdl].fitsfilesize=finalsize;   /* and initial file size  */
  return status;
}